

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O3

utf8_char minijson::detail::utf16_to_utf8(uint16_t high,uint16_t low)

{
  uint uVar1;
  uint uVar2;
  uint8_t auVar3 [4];
  utf8_char uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if ((ushort)(high + 0x2000) < 0xf800) {
    if (low != 0) {
LAB_00106510:
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&encoding_error::typeinfo,0);
    }
    uVar6 = (uint)high;
    uVar8 = 0;
    if (high < 0x80) {
      uVar7 = 0;
      uVar2 = 0;
      uVar8 = 0;
    }
    else {
      if (high < 0x800) {
        uVar7 = 0;
        uVar1 = high >> 6 | 0xc0;
        uVar2 = uVar6;
      }
      else {
        uVar2 = (uint)(high >> 6);
        uVar7 = uVar6 & 0x3f | 0x80;
        uVar1 = high >> 0xc | 0xe0;
      }
      uVar6 = uVar1;
      uVar2 = uVar2 & 0x3f | 0x80;
    }
  }
  else {
    if ((0xdbff < high) || ((ushort)(low + 0x2000) < 0xfc00)) goto LAB_00106510;
    uVar8 = (int)(short)low + (uint)(ushort)(high + 0x2800) * 0x400 + 0x12400;
    uVar6 = uVar8 >> 0x12 | 0xf0;
    uVar2 = uVar8 >> 0xc & 0x3f | 0x80;
    uVar7 = uVar8 >> 6 & 0x3f | 0x80;
    uVar8 = ((int)(short)low & 0x3fU) << 0x18 | 0x80000000;
  }
  auVar3 = (uint8_t  [4])(uVar2 << 8 | uVar6 | uVar7 << 0x10 | uVar8);
  uVar4.bytes[0] = auVar3[0];
  uVar4.bytes[1] = auVar3[1];
  uVar4.bytes[2] = auVar3[2];
  uVar4.bytes[3] = auVar3[3];
  return (utf8_char)uVar4.bytes;
}

Assistant:

inline utf8_char utf16_to_utf8(uint16_t high, uint16_t low)
{
    return utf32_to_utf8(utf16_to_utf32(high, low));
}